

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O0

void __thiscall ami_nvar_t::nvar_entry_body_t::_read(nvar_entry_body_t *this)

{
  bool bVar1;
  uint8_t uVar2;
  int32_t iVar3;
  nvar_entry_t *pnVar4;
  nvar_attributes_t *pnVar5;
  ucs2_string_t *this_00;
  string local_f0;
  string local_d0;
  unique_ptr<ami_nvar_t::ucs2_string_t,_std::default_delete<ami_nvar_t::ucs2_string_t>_>
  local_b0 [3];
  allocator<char> local_91;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  nvar_entry_body_t *local_10;
  nvar_entry_body_t *this_local;
  
  this->n_guid_index = true;
  local_10 = this;
  pnVar4 = _parent(this);
  pnVar5 = nvar_entry_t::attributes(pnVar4);
  bVar1 = nvar_attributes_t::local_guid(pnVar5);
  if (!bVar1) {
    pnVar4 = _parent(this);
    pnVar5 = nvar_entry_t::attributes(pnVar4);
    bVar1 = nvar_attributes_t::data_only(pnVar5);
    if (!bVar1) {
      pnVar4 = _parent(this);
      pnVar5 = nvar_entry_t::attributes(pnVar4);
      bVar1 = nvar_attributes_t::valid(pnVar5);
      if (bVar1) {
        this->n_guid_index = false;
        uVar2 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
        this->m_guid_index = uVar2;
      }
    }
  }
  this->n_guid = true;
  pnVar4 = _parent(this);
  pnVar5 = nvar_entry_t::attributes(pnVar4);
  bVar1 = nvar_attributes_t::local_guid(pnVar5);
  if (bVar1) {
    pnVar4 = _parent(this);
    pnVar5 = nvar_entry_t::attributes(pnVar4);
    bVar1 = nvar_attributes_t::data_only(pnVar5);
    if (!bVar1) {
      pnVar4 = _parent(this);
      pnVar5 = nvar_entry_t::attributes(pnVar4);
      bVar1 = nvar_attributes_t::valid(pnVar5);
      if (bVar1) {
        this->n_guid = false;
        kaitai::kstream::read_bytes_abi_cxx11_(&local_30,(this->super_kstruct).m__io,0x10);
        std::__cxx11::string::operator=((string *)&this->m_guid,(string *)&local_30);
        std::__cxx11::string::~string((string *)&local_30);
      }
    }
  }
  this->n_ascii_name = true;
  pnVar4 = _parent(this);
  pnVar5 = nvar_entry_t::attributes(pnVar4);
  bVar1 = nvar_attributes_t::ascii_name(pnVar5);
  if (bVar1) {
    pnVar4 = _parent(this);
    pnVar5 = nvar_entry_t::attributes(pnVar4);
    bVar1 = nvar_attributes_t::data_only(pnVar5);
    if (!bVar1) {
      pnVar4 = _parent(this);
      pnVar5 = nvar_entry_t::attributes(pnVar4);
      bVar1 = nvar_attributes_t::valid(pnVar5);
      if (bVar1) {
        this->n_ascii_name = false;
        kaitai::kstream::read_bytes_term_abi_cxx11_
                  (&local_70,(this->super_kstruct).m__io,'\0',false,true,true);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"ASCII",&local_91);
        kaitai::kstream::bytes_to_str(&local_50,&local_70,&local_90);
        std::__cxx11::string::operator=((string *)&this->m_ascii_name,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator(&local_91);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
  }
  this->n_ucs2_name = true;
  pnVar4 = _parent(this);
  pnVar5 = nvar_entry_t::attributes(pnVar4);
  bVar1 = nvar_attributes_t::ascii_name(pnVar5);
  if (!bVar1) {
    pnVar4 = _parent(this);
    pnVar5 = nvar_entry_t::attributes(pnVar4);
    bVar1 = nvar_attributes_t::data_only(pnVar5);
    if (!bVar1) {
      pnVar4 = _parent(this);
      pnVar5 = nvar_entry_t::attributes(pnVar4);
      bVar1 = nvar_attributes_t::valid(pnVar5);
      if (bVar1) {
        this->n_ucs2_name = false;
        this_00 = (ucs2_string_t *)operator_new(0x28);
        ucs2_string_t::ucs2_string_t(this_00,(this->super_kstruct).m__io,this,this->m__root);
        std::unique_ptr<ami_nvar_t::ucs2_string_t,std::default_delete<ami_nvar_t::ucs2_string_t>>::
        unique_ptr<std::default_delete<ami_nvar_t::ucs2_string_t>,void>
                  ((unique_ptr<ami_nvar_t::ucs2_string_t,std::default_delete<ami_nvar_t::ucs2_string_t>>
                    *)local_b0,this_00);
        std::unique_ptr<ami_nvar_t::ucs2_string_t,_std::default_delete<ami_nvar_t::ucs2_string_t>_>
        ::operator=(&this->m_ucs2_name,local_b0);
        std::unique_ptr<ami_nvar_t::ucs2_string_t,_std::default_delete<ami_nvar_t::ucs2_string_t>_>
        ::~unique_ptr(local_b0);
      }
    }
  }
  this->n_invoke_data_start = true;
  iVar3 = data_start_offset(this);
  if (-1 < iVar3) {
    this->n_invoke_data_start = false;
    kaitai::kstream::read_bytes_abi_cxx11_(&local_d0,(this->super_kstruct).m__io,0);
    std::__cxx11::string::operator=((string *)&this->m_invoke_data_start,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  kaitai::kstream::read_bytes_full_abi_cxx11_(&local_f0,(this->super_kstruct).m__io);
  std::__cxx11::string::operator=((string *)&this->m_data,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  return;
}

Assistant:

void ami_nvar_t::nvar_entry_body_t::_read() {
    n_guid_index = true;
    if ( ((!(_parent()->attributes()->local_guid())) && (!(_parent()->attributes()->data_only())) && (_parent()->attributes()->valid())) ) {
        n_guid_index = false;
        m_guid_index = m__io->read_u1();
    }
    n_guid = true;
    if ( ((_parent()->attributes()->local_guid()) && (!(_parent()->attributes()->data_only())) && (_parent()->attributes()->valid())) ) {
        n_guid = false;
        m_guid = m__io->read_bytes(16);
    }
    n_ascii_name = true;
    if ( ((_parent()->attributes()->ascii_name()) && (!(_parent()->attributes()->data_only())) && (_parent()->attributes()->valid())) ) {
        n_ascii_name = false;
        m_ascii_name = kaitai::kstream::bytes_to_str(m__io->read_bytes_term(0, false, true, true), std::string("ASCII"));
    }
    n_ucs2_name = true;
    if ( ((!(_parent()->attributes()->ascii_name())) && (!(_parent()->attributes()->data_only())) && (_parent()->attributes()->valid())) ) {
        n_ucs2_name = false;
        m_ucs2_name = std::unique_ptr<ucs2_string_t>(new ucs2_string_t(m__io, this, m__root));
    }
    n_invoke_data_start = true;
    if (data_start_offset() >= 0) {
        n_invoke_data_start = false;
        m_invoke_data_start = m__io->read_bytes(0);
    }
    m_data = m__io->read_bytes_full();
}